

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel_p.h
# Opt level: O3

void __thiscall
QSqlTableModelPrivate::ModifiedRow::ModifiedRow(ModifiedRow *this,Op o,QSqlRecord *r)

{
  QSqlRecord *this_00;
  Op OVar1;
  int iVar2;
  uint uVar3;
  
  this->m_op = None;
  this_00 = &this->m_rec;
  QSqlRecord::QSqlRecord(this_00);
  QSqlRecord::QSqlRecord(&this->m_db_values,r);
  this->m_insert = o == Insert;
  if (o == None) {
    this->m_submitted = true;
  }
  if (this->m_op != o) {
    this->m_submitted = (o & ~Update) != Insert;
    this->m_op = o;
    QSqlRecord::operator=(this_00,&this->m_db_values);
    OVar1 = this->m_op;
    iVar2 = QSqlRecord::count(this_00);
    if (0 < iVar2) {
      uVar3 = iVar2 + 1;
      do {
        QSqlRecord::setGenerated(this_00,uVar3 - 2,OVar1 == Delete);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

inline ModifiedRow(Op o = None, const QSqlRecord &r = QSqlRecord())
            : m_op(None), m_db_values(r), m_insert(o == Insert)
        { setOp(o); }